

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O2

void __thiscall
CServerBrowser::SetFavoritePassword(CServerBrowser *this,char *pAddress,char *pPassword)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  CServerEntry *pCVar4;
  int *piVar5;
  long in_FS_OFFSET;
  NETADDR Addr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CServerBrowserFavorites::AddFavoriteEx
                    (&this->m_ServerBrowserFavorites,pAddress,(NETADDR *)0x0,false,pPassword);
  if (bVar2) {
    Addr.type = 0;
    Addr.ip[0] = '\0';
    Addr.ip[1] = '\0';
    Addr.ip[2] = '\0';
    Addr.ip[3] = '\0';
    Addr.ip[4] = '\0';
    Addr.ip[5] = '\0';
    Addr.ip[6] = '\0';
    Addr.ip[7] = '\0';
    Addr.ip[8] = '\0';
    Addr.ip[9] = '\0';
    Addr.ip[10] = '\0';
    Addr.ip[0xb] = '\0';
    Addr.ip[0xc] = '\0';
    Addr.ip[0xd] = '\0';
    Addr.ip[0xe] = '\0';
    Addr.ip[0xf] = '\0';
    Addr.port = 0;
    Addr.reserved = 0;
    iVar3 = net_addr_from_str(&Addr,pAddress);
    if (iVar3 == 0) {
      piVar5 = &this->m_aServerlist[0].m_NumServers;
      for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
        pCVar4 = Find(this,iVar3,&Addr);
        if ((pCVar4 != (CServerEntry *)0x0) &&
           ((pCVar4->m_Info).m_Favorite = true, iVar3 == this->m_ActServerlistType)) {
          CServerBrowserFilter::Sort
                    (&this->m_ServerBrowserFilter,*(CServerEntry ***)(piVar5 + 0x202),*piVar5,2);
        }
        piVar5 = piVar5 + 0x208;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServerBrowser::SetFavoritePassword(const char *pAddress, const char *pPassword)
{
	if(m_ServerBrowserFavorites.AddFavoriteEx(pAddress, 0, false, pPassword))
	{
		NETADDR Addr = {0};
		if(net_addr_from_str(&Addr, pAddress))
			return;
		for(int i = 0; i < NUM_TYPES; ++i)
		{
			CServerEntry *pEntry = Find(i, Addr);
			if(pEntry)
			{
				pEntry->m_Info.m_Favorite = true;

				// refresh servers in all filters where favorites are filtered
				if(i == m_ActServerlistType)
					m_ServerBrowserFilter.Sort(m_aServerlist[m_ActServerlistType].m_ppServerlist, m_aServerlist[m_ActServerlistType].m_NumServers, CServerBrowserFilter::RESORT_FLAG_FAV);
			}
		}
	}
}